

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expFuncFileSize(ExpressionValue *__return_storage_ptr__,Identifier *funcName,
               vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters)

{
  bool bVar1;
  uintmax_t value;
  undefined1 local_88 [8];
  error_code error;
  path local_68;
  undefined1 local_48 [8];
  path fullName;
  StringLiteral *fileName;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  Identifier *funcName_local;
  
  bVar1 = getExpFuncParameter(parameters,0,(StringLiteral **)((long)&fullName._path.field_2 + 8),
                              funcName,false);
  if (bVar1) {
    StringLiteral::path(&local_68,(StringLiteral *)fullName._path.field_2._8_8_);
    getFullPathName((path *)local_48,&local_68);
    ghc::filesystem::path::~path(&local_68);
    std::error_code::error_code((error_code *)local_88);
    value = ghc::filesystem::file_size((path *)local_48,(error_code *)local_88);
    ExpressionValue::ExpressionValue(__return_storage_ptr__,value);
    ghc::filesystem::path::~path((path *)local_48);
  }
  else {
    ExpressionValue::ExpressionValue(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expFuncFileSize(const Identifier &funcName, const std::vector<ExpressionValue>& parameters)
{
	const StringLiteral* fileName;
	GET_PARAM(parameters,0,fileName);

	auto fullName = getFullPathName(fileName->path());

	std::error_code error;
	return ExpressionValue(static_cast<int64_t>(fs::file_size(fullName, error)));
}